

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.h
# Opt level: O1

void __thiscall
Js::DynamicTypeHandler::SetHasOnlyWritableDataProperties(DynamicTypeHandler *this,bool value)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar2 = GetPropertyTypes(this);
  if ((bool)((bVar2 & 0x10) >> 4) != value) {
    this->propertyTypes = this->propertyTypes ^ 0x10;
  }
  bVar2 = this->propertyTypes;
  this->propertyTypes = bVar2 | 0x20;
  if ((bVar2 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x1a1,"((propertyTypes & 0x01) != 0)",
                                "(propertyTypes & PropertyTypesReserved) != 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void SetHasOnlyWritableDataProperties(bool value)
        {
            if (value != GetHasOnlyWritableDataProperties())
            {
                propertyTypes ^= PropertyTypesWritableDataOnly;
            }

            // Turn on the detection bit.
            propertyTypes |= PropertyTypesWritableDataOnlyDetection;
            Assert((propertyTypes & PropertyTypesReserved) != 0);
        }